

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

int t2_decode_packets(opj_t2_t *t2,uchar *src,int len,int tileno,opj_tcd_tile_t *tile,
                     opj_codestream_info_t *cstr_info)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  opj_image_t *image;
  opj_cp_t *cp;
  opj_tcp_t *poVar5;
  opj_cp_t *poVar6;
  opj_tcd_resolution_t *poVar7;
  opj_tcd_precinct_t *poVar8;
  opj_tcd_cblk_enc_t *poVar9;
  opj_tcd_seg_t *poVar10;
  opj_tile_info_t *poVar11;
  opj_tp_info_t *poVar12;
  bool bVar13;
  int iVar14;
  opj_bool oVar15;
  uint uVar16;
  int iVar17;
  OPJ_UINT32 OVar18;
  uint uVar19;
  int iVar20;
  opj_pi_iterator_t *pi;
  opj_bio_t *bio;
  uchar **ppuVar21;
  long lVar22;
  uchar *puVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  opj_packet_info_t *poVar27;
  opj_tcd_cblk_dec_t *cblk;
  int i;
  int iVar28;
  int iVar29;
  opj_tcd_layer_t *poVar30;
  int iVar31;
  opj_pi_iterator_t *pi_00;
  long lVar32;
  int local_100;
  uchar *local_c0;
  opj_packet_info_t *local_b8;
  int local_a0;
  
  image = t2->image;
  cp = t2->cp;
  pi = pi_create_decode(image,cp,tileno);
  local_a0 = -999;
  if (pi != (opj_pi_iterator_t *)0x0) {
    local_a0 = (int)src;
    if (cp->tcps[tileno].numpocs < 0) {
      lVar24 = 0;
      local_100 = 0;
    }
    else {
      local_100 = 0;
      iVar28 = 0;
      lVar24 = 0;
      do {
        pi_00 = pi + lVar24;
        while (oVar15 = pi_next(pi_00), oVar15 != 0) {
          if ((cp->layer == 0) || (iVar31 = 0, pi_00->layno < cp->layer)) {
            if (cstr_info == (opj_codestream_info_t *)0x0) {
              local_b8 = (opj_packet_info_t *)0x0;
            }
            else {
              local_b8 = cstr_info->tile[tileno].packet + cstr_info->packno;
            }
            poVar5 = cp->tcps;
            poVar6 = t2->cp;
            iVar20 = pi_00->compno;
            iVar2 = pi_00->resno;
            iVar3 = pi_00->precno;
            iVar4 = pi_00->layno;
            poVar7 = tile->comps[iVar20].resolutions;
            if ((iVar4 == 0) && (0 < poVar7[iVar2].numbands)) {
              lVar32 = 0;
              do {
                if ((poVar7[iVar2].bands[lVar32].x1 != poVar7[iVar2].bands[lVar32].x0) &&
                   (poVar7[iVar2].bands[lVar32].y1 != poVar7[iVar2].bands[lVar32].y0)) {
                  poVar8 = poVar7[iVar2].bands[lVar32].precincts;
                  tgt_reset(poVar8[iVar3].incltree);
                  tgt_reset(poVar8[iVar3].imsbtree);
                  uVar16 = poVar8[iVar3].ch * poVar8[iVar3].cw;
                  if (0 < (int)uVar16) {
                    lVar25 = 0;
                    do {
                      *(undefined4 *)((long)&(poVar8[iVar3].cblks.enc)->numpasses + lVar25) = 0;
                      lVar25 = lVar25 + 0x38;
                    } while ((ulong)uVar16 * 0x38 - lVar25 != 0);
                  }
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < poVar7[iVar2].numbands);
            }
            puVar23 = src;
            if ((poVar5[tileno].csty & 2) != 0) {
              if ((*src == 0xff) && (src[1] == 0x91)) {
                puVar23 = src + 6;
              }
              else {
                opj_event_msg(t2->cinfo,2,"Expected SOP marker\n");
              }
            }
            iVar31 = (int)src;
            iVar14 = (len + local_a0) - iVar31;
            bio = bio_create();
            iVar29 = (int)puVar23;
            if (poVar6->ppm == 1) {
              local_c0 = poVar6->ppm_data;
              iVar17 = poVar6->ppm_len;
LAB_0020a47a:
              bio_init_dec(bio,local_c0,iVar17);
            }
            else {
              if (poVar5[tileno].ppt == 1) {
                local_c0 = poVar5[tileno].ppt_data;
                iVar17 = poVar5[tileno].ppt_len;
                goto LAB_0020a47a;
              }
              bio_init_dec(bio,puVar23,(iVar31 + iVar14) - iVar29);
              local_c0 = puVar23;
            }
            iVar17 = bio_read(bio,1);
            if (iVar17 == 0) {
              bio_inalign(bio);
              iVar20 = bio_numbytes(bio);
              local_c0 = local_c0 + iVar20;
              bio_destroy(bio);
              if ((poVar5[tileno].csty & 4) != 0) {
                if ((*local_c0 == 0xff) && (local_c0[1] == 0x92)) {
                  local_c0 = local_c0 + 2;
                }
                else {
                  puts("Error : expected EPH marker");
                }
              }
              if (local_b8 != (opj_packet_info_t *)0x0) {
                local_b8->end_ph_pos = (long)(iVar29 - iVar31);
              }
              iVar20 = (int)local_c0;
              if (poVar6->ppm == 1) {
                poVar6->ppm_len = poVar6->ppm_len + (*(int *)&poVar6->ppm_data - iVar20);
                poVar6->ppm_data = local_c0;
              }
              else {
                if (poVar5[tileno].ppt != 1) {
                  iVar31 = iVar20 - iVar31;
                  goto LAB_0020ab1b;
                }
                poVar5[tileno].ppt_len =
                     poVar5[tileno].ppt_len + (*(int *)&poVar5[tileno].ppt_data - iVar20);
                poVar5[tileno].ppt_data = local_c0;
              }
              iVar31 = iVar29 - iVar31;
            }
            else {
              if (0 < poVar7[iVar2].numbands) {
                lVar32 = 0;
                do {
                  if (((poVar7[iVar2].bands[lVar32].x1 != poVar7[iVar2].bands[lVar32].x0) &&
                      (poVar7[iVar2].bands[lVar32].y1 != poVar7[iVar2].bands[lVar32].y0)) &&
                     (poVar8 = poVar7[iVar2].bands[lVar32].precincts,
                     0 < poVar8[iVar3].ch * poVar8[iVar3].cw)) {
                    lVar25 = 0;
                    do {
                      poVar9 = poVar8[iVar3].cblks.enc;
                      if ((&poVar9->numpasses)[lVar25 * 0xe] == 0) {
                        OVar18 = tgt_decode(bio,poVar8[iVar3].incltree,(OPJ_UINT32)lVar25,iVar4 + 1)
                        ;
                      }
                      else {
                        OVar18 = bio_read(bio,1);
                      }
                      cblk = (opj_tcd_cblk_dec_t *)(&poVar9->data + lVar25 * 7);
                      if (OVar18 == 0) {
                        cblk->numnewpasses = 0;
                      }
                      else {
                        if (cblk->numsegs == 0) {
                          iVar29 = 0;
                          do {
                            OVar18 = tgt_decode(bio,poVar8[iVar3].imsbtree,(OPJ_UINT32)lVar25,iVar29
                                               );
                            iVar29 = iVar29 + 1;
                          } while (OVar18 == 0);
                          cblk->numbps = (poVar7[iVar2].bands[lVar32].numbps - iVar29) + 2;
                          cblk->numlenbits = 3;
                        }
                        iVar29 = t2_getnumpasses(bio);
                        cblk->numnewpasses = iVar29;
                        iVar29 = -1;
                        do {
                          iVar17 = bio_read(bio,1);
                          iVar29 = iVar29 + 1;
                        } while (iVar17 != 0);
                        cblk->numlenbits = cblk->numlenbits + iVar29;
                        uVar16 = cblk->numsegs;
                        if ((long)(int)uVar16 == 0) {
                          uVar26 = 0;
                          t2_init_seg(cblk,0,poVar5[tileno].tccps[iVar20].cblksty,1);
                        }
                        else {
                          uVar26 = (long)(int)uVar16 - 1;
                          if (cblk->segs[uVar26].numpasses == cblk->segs[uVar26].maxpasses) {
                            t2_init_seg(cblk,uVar16,poVar5[tileno].tccps[iVar20].cblksty,0);
                            uVar26 = (ulong)uVar16;
                          }
                        }
                        uVar16 = cblk->numnewpasses;
                        while( true ) {
                          poVar10 = cblk->segs;
                          iVar29 = (int)uVar26;
                          uVar19 = poVar10[iVar29].maxpasses - poVar10[iVar29].numpasses;
                          if ((int)uVar16 <= (int)uVar19) {
                            uVar19 = uVar16;
                          }
                          poVar10[iVar29].numnewpasses = uVar19;
                          iVar17 = 0;
                          if (1 < (int)uVar19) {
                            iVar17 = 0;
                            uVar26 = (ulong)uVar19;
                            do {
                              iVar17 = iVar17 + 1;
                              uVar19 = (uint)uVar26;
                              uVar26 = uVar26 >> 1;
                            } while (3 < uVar19);
                          }
                          OVar18 = bio_read(bio,iVar17 + cblk->numlenbits);
                          poVar10 = cblk->segs;
                          poVar10[iVar29].newlen = OVar18;
                          uVar16 = uVar16 - poVar10[iVar29].numnewpasses;
                          if ((int)uVar16 < 1) break;
                          uVar26 = (ulong)(iVar29 + 1U);
                          t2_init_seg(cblk,iVar29 + 1U,poVar5[tileno].tccps[iVar20].cblksty,0);
                        }
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < (long)poVar8[iVar3].ch * (long)poVar8[iVar3].cw);
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 < poVar7[iVar2].numbands);
              }
              iVar20 = bio_inalign(bio);
              if (iVar20 == 0) {
                iVar20 = bio_numbytes(bio);
                local_c0 = local_c0 + iVar20;
                bio_destroy(bio);
                if ((poVar5[tileno].csty & 4) != 0) {
                  if ((*local_c0 != 0xff) || (local_c0[1] != 0x92)) {
                    opj_event_msg(t2->cinfo,1,"Expected EPH marker\n");
                    iVar31 = -999;
                    goto LAB_0020ab1b;
                  }
                  local_c0 = local_c0 + 2;
                }
                iVar20 = (int)local_c0;
                if (local_b8 != (opj_packet_info_t *)0x0) {
                  local_b8->end_ph_pos = (long)(iVar20 - iVar31);
                }
                if (poVar6->ppm == 1) {
                  ppuVar21 = &poVar6->ppm_data;
                  poVar6->ppm_len = poVar6->ppm_len + (*(int *)&poVar6->ppm_data - iVar20);
LAB_0020a936:
                  *ppuVar21 = local_c0;
                  local_c0 = puVar23;
                }
                else if (poVar5[tileno].ppt == 1) {
                  ppuVar21 = &poVar5[tileno].ppt_data;
                  poVar5[tileno].ppt_len =
                       poVar5[tileno].ppt_len + (*(int *)&poVar5[tileno].ppt_data - iVar20);
                  goto LAB_0020a936;
                }
                if (0 < poVar7[iVar2].numbands) {
                  lVar32 = 0;
                  do {
                    iVar20 = 0x15;
                    if ((poVar7[iVar2].bands[lVar32].x1 != poVar7[iVar2].bands[lVar32].x0) &&
                       (poVar7[iVar2].bands[lVar32].y1 != poVar7[iVar2].bands[lVar32].y0)) {
                      poVar8 = poVar7[iVar2].bands[lVar32].precincts;
                      iVar20 = 0;
                      if (0 < poVar8[iVar3].ch * poVar8[iVar3].cw) {
                        lVar25 = 0;
                        do {
                          if ((&(poVar8[iVar3].cblks.enc)->numlenbits)[lVar25 * 0xe] == 0) {
                            iVar20 = 0x18;
                          }
                          else {
                            ppuVar21 = &(poVar8[iVar3].cblks.enc)->data + lVar25 * 7;
                            lVar22 = (long)*(int *)(ppuVar21 + 6);
                            poVar30 = (opj_tcd_layer_t *)ppuVar21[1];
                            if (lVar22 == 0) {
                              *(int *)(ppuVar21 + 6) = 1;
                              *(int *)(ppuVar21 + 5) = 0;
                            }
                            else if (*(int *)((long)poVar30 + lVar22 * 0x28 + -0x1c) ==
                                     *(int *)((long)poVar30 + (lVar22 * 5 + -2) * 8)) {
                              poVar30 = (opj_tcd_layer_t *)((long)poVar30 + lVar22 * 0x28);
                              *(int *)(ppuVar21 + 6) = *(int *)(ppuVar21 + 6) + 1;
                            }
                            else {
                              poVar30 = (opj_tcd_layer_t *)((long)poVar30 + (lVar22 * 5 + -5) * 8);
                            }
                            do {
                              if (src + iVar14 < local_c0 + *(uint *)&poVar30[1].disto) {
                                iVar20 = 1;
                                goto LAB_0020aa94;
                              }
                              puVar23 = (uchar *)realloc(*ppuVar21,
                                                         (ulong)(*(uint *)&poVar30[1].disto +
                                                                *(int *)(ppuVar21 + 5)));
                              *ppuVar21 = puVar23;
                              memcpy(puVar23 + *(int *)(ppuVar21 + 5),local_c0,
                                     (ulong)*(uint *)&poVar30[1].disto);
                              iVar20 = *(int *)((long)&poVar30->disto + 4);
                              if (iVar20 == 0) {
                                *(uchar ***)poVar30 = ppuVar21;
                                *(int *)&poVar30->disto = *(int *)(ppuVar21 + 5);
                              }
                              uVar16 = *(uint *)&poVar30[1].disto;
                              *(uint *)(ppuVar21 + 5) = *(int *)(ppuVar21 + 5) + uVar16;
                              piVar1 = (int *)((long)&poVar30->data + 4);
                              *piVar1 = *piVar1 + uVar16;
                              *(OPJ_UINT32 *)((long)&poVar30->disto + 4) = iVar20 + poVar30[1].len;
                              iVar20 = *(int *)((long)ppuVar21 + 0x2c) - poVar30[1].len;
                              *(int *)((long)ppuVar21 + 0x2c) = iVar20;
                              if (0 < iVar20) {
                                poVar30 = (opj_tcd_layer_t *)&poVar30[1].data;
                                *(int *)(ppuVar21 + 6) = *(int *)(ppuVar21 + 6) + 1;
                              }
                              local_c0 = local_c0 + uVar16;
                            } while (0 < iVar20);
                            iVar20 = 0;
                          }
LAB_0020aa94:
                          if ((iVar20 != 0x18) && (iVar20 != 0)) goto LAB_0020aae6;
                          lVar25 = lVar25 + 1;
                        } while (lVar25 < (long)poVar8[iVar3].ch * (long)poVar8[iVar3].cw);
                        iVar20 = 0;
                      }
                    }
LAB_0020aae6:
                    if ((iVar20 != 0x15) && (iVar20 != 0)) goto LAB_0020a75e;
                    lVar32 = lVar32 + 1;
                  } while (lVar32 < poVar7[iVar2].numbands);
                }
                iVar31 = (int)local_c0 - iVar31;
              }
              else {
                bio_destroy(bio);
LAB_0020a75e:
                iVar31 = -999;
              }
            }
          }
LAB_0020ab1b:
          if (iVar31 == -999) {
            return -999;
          }
          if (iVar31 < 1) {
            OVar18 = image->comps[pi_00->compno].resno_decoded;
          }
          else {
            OVar18 = image->comps[pi_00->compno].resno_decoded;
            if ((int)OVar18 < pi_00->resno) {
              OVar18 = pi_00->resno;
            }
          }
          image->comps[pi_00->compno].resno_decoded = OVar18;
          if (cstr_info != (opj_codestream_info_t *)0x0) {
            poVar11 = cstr_info->tile;
            iVar20 = cstr_info->packno;
            poVar27 = poVar11[tileno].packet + iVar20;
            if ((long)iVar20 == 0) {
              lVar32 = (long)poVar11[tileno].end_header + 1;
            }
            else {
              poVar12 = poVar11[tileno].tp;
              if (poVar27[-1].end_pos < (long)poVar12[iVar28].tp_end_pos) {
                if ((cp->tp_on == '\0') || (lVar32 = poVar27->start_pos, lVar32 == 0)) {
                  lVar32 = poVar27[-1].end_pos + 1;
                }
              }
              else {
                poVar12[iVar28].tp_numpacks = iVar20 - local_100;
                poVar12[iVar28].tp_start_pack = local_100;
                iVar28 = iVar28 + 1;
                lVar32 = (long)poVar11[tileno].tp[iVar28].tp_end_header + 1;
                local_100 = iVar20;
              }
            }
            poVar27->start_pos = lVar32;
            poVar27->end_pos = lVar32 + iVar31 + -1;
            poVar27->end_ph_pos = poVar27->end_ph_pos + lVar32 + -1;
            cstr_info->packno = iVar20 + 1;
          }
          src = src + iVar31;
        }
        bVar13 = lVar24 < cp->tcps[tileno].numpocs;
        lVar24 = lVar24 + 1;
      } while (bVar13);
      lVar24 = (long)iVar28;
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      poVar12 = cstr_info->tile[tileno].tp;
      poVar12[lVar24].tp_numpacks = cstr_info->packno - local_100;
      poVar12[lVar24].tp_start_pack = local_100;
    }
    pi_destroy(pi,cp,tileno);
    local_a0 = (int)src - local_a0;
  }
  return local_a0;
}

Assistant:

int t2_decode_packets(opj_t2_t *t2, unsigned char *src, int len, int tileno, opj_tcd_tile_t *tile, opj_codestream_info_t *cstr_info) {
	unsigned char *c = src;
	opj_pi_iterator_t *pi;
	int pino, e = 0;
	int n = 0, curtp = 0;
	int tp_start_packno;

	opj_image_t *image = t2->image;
	opj_cp_t *cp = t2->cp;
	
	/* create a packet iterator */
	pi = pi_create_decode(image, cp, tileno);
	if(!pi) {
		/* TODO: throw an error */
		return -999;
	}

	tp_start_packno = 0;
	
	for (pino = 0; pino <= cp->tcps[tileno].numpocs; pino++) {
		while (pi_next(&pi[pino])) {
			if ((cp->layer==0) || (cp->layer>=((pi[pino].layno)+1))) {
				opj_packet_info_t *pack_info;
				if (cstr_info)
					pack_info = &cstr_info->tile[tileno].packet[cstr_info->packno];
				else
					pack_info = NULL;
				e = t2_decode_packet(t2, c, src + len - c, tile, &cp->tcps[tileno], &pi[pino], pack_info);
			} else {
				e = 0;
			}
			if(e == -999) return -999;
			/* progression in resolution */
			image->comps[pi[pino].compno].resno_decoded =	
				(e > 0) ? 
				int_max(pi[pino].resno, image->comps[pi[pino].compno].resno_decoded) 
				: image->comps[pi[pino].compno].resno_decoded;
			n++;

			/* INDEX >> */
			if(cstr_info) {
				opj_tile_info_t *info_TL = &cstr_info->tile[tileno];
				opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
				if (!cstr_info->packno) {
					info_PK->start_pos = info_TL->end_header + 1;
				} else if (info_TL->packet[cstr_info->packno-1].end_pos >= (int)cstr_info->tile[tileno].tp[curtp].tp_end_pos){ /* New tile part*/
					info_TL->tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in previous tile-part*/
          info_TL->tp[curtp].tp_start_pack = tp_start_packno;
					tp_start_packno = cstr_info->packno;
					curtp++;
					info_PK->start_pos = cstr_info->tile[tileno].tp[curtp].tp_end_header+1;
				} else {
					info_PK->start_pos = (cp->tp_on && info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
				}
				info_PK->end_pos = info_PK->start_pos + e - 1;
				info_PK->end_ph_pos += info_PK->start_pos - 1;	/* End of packet header which now only represents the distance 
																												// to start of packet is incremented by value of start of packet*/
				cstr_info->packno++;
			}
			/* << INDEX */
			
			if (e == -999) {		/* ADD */
				break;
			} else {
				c += e;
			}			
		}
	}
	/* INDEX >> */
	if(cstr_info) {
		cstr_info->tile[tileno].tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in last tile-part*/
    cstr_info->tile[tileno].tp[curtp].tp_start_pack = tp_start_packno;
	}
	/* << INDEX */

	/* don't forget to release pi */
	pi_destroy(pi, cp, tileno);
	
	if (e == -999) {
		return e;
	}
	
	return (c - src);
}